

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

void __thiscall ON_String::CopyToArray(ON_String *this,ON_String *s)

{
  char *pcVar1;
  char *s_00;
  ON_Internal_Empty_aString *pOVar2;
  
  pcVar1 = s->m_s;
  pOVar2 = &empty_astring;
  if (pcVar1 != (char *)0x0) {
    pOVar2 = (ON_Internal_Empty_aString *)(pcVar1 + -0xc);
  }
  s_00 = (char *)0x0;
  if (0 < (pOVar2->header).string_capacity) {
    s_00 = pcVar1;
  }
  CopyToArray(this,(pOVar2->header).string_length,s_00);
  return;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}